

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  double *pdVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  code *pcVar13;
  code *pcVar14;
  long lVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  int *piVar21;
  int *piVar22;
  undefined4 uVar23;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  double in_XMM0_Qa;
  double __x;
  int status;
  N_Vector *Xv;
  sunrealtype *cv;
  SUNPSolveFn psolve;
  SUNATimesFn atimes;
  void *P_data;
  void *A_data;
  int *nli;
  int gstype;
  int max_restarts;
  int ntries;
  int krydim;
  int l_max;
  int l_plus_1;
  int l;
  int k;
  int j;
  int i;
  int *zeroguess;
  int converged;
  int scale1;
  int scale2;
  int preOnRight;
  int preOnLeft;
  sunrealtype rho;
  sunrealtype s_product;
  sunrealtype r_norm;
  sunrealtype rotation_product;
  sunrealtype beta;
  sunrealtype *res_norm;
  sunrealtype *yg;
  sunrealtype *givens;
  sunrealtype **Hes;
  N_Vector s2;
  N_Vector s1;
  N_Vector vtemp;
  N_Vector xcor;
  N_Vector *V;
  SUNContext_conflict sunctx_local_scope_;
  double local_138;
  int local_e8;
  int local_e4;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int local_4;
  
  local_e4 = 0;
  iVar20 = *(int *)*in_RDI;
  iVar1 = *(int *)(*in_RDI + 0xc);
  iVar2 = *(int *)(*in_RDI + 8);
  puVar3 = *(undefined8 **)(*in_RDI + 0x60);
  lVar4 = *(long *)(*in_RDI + 0x68);
  lVar5 = *(long *)(*in_RDI + 0x70);
  uVar6 = *(undefined8 *)(*in_RDI + 0x78);
  pdVar7 = *(double **)(*in_RDI + 0x80);
  uVar8 = *(undefined8 *)(*in_RDI + 0x88);
  lVar9 = *(long *)(*in_RDI + 0x50);
  lVar10 = *(long *)(*in_RDI + 0x58);
  uVar11 = *(undefined8 *)(*in_RDI + 0x30);
  uVar12 = *(undefined8 *)(*in_RDI + 0x48);
  pcVar13 = *(code **)(*in_RDI + 0x28);
  pcVar14 = *(code **)(*in_RDI + 0x40);
  piVar21 = (int *)(*in_RDI + 0x10);
  piVar22 = (int *)(*in_RDI + 0x14);
  lVar15 = *in_RDI;
  puVar16 = *(undefined8 **)(*in_RDI + 0x90);
  puVar17 = *(undefined8 **)(*in_RDI + 0x98);
  *piVar22 = 0;
  bVar18 = false;
  bVar24 = true;
  if (*(int *)(*in_RDI + 4) != 1) {
    bVar24 = *(int *)(*in_RDI + 4) == 3;
  }
  bVar25 = true;
  if (*(int *)(*in_RDI + 4) != 2) {
    bVar25 = *(int *)(*in_RDI + 4) == 3;
  }
  bVar26 = lVar10 != 0;
  if (*piVar21 == 0) {
    iVar19 = (*pcVar13)(uVar11,in_RDX,uVar8);
    if (iVar19 != 0) {
      *piVar21 = 0;
      uVar23 = 0x323;
      if (iVar19 < 0) {
        uVar23 = 0xfffffcdb;
      }
      *(undefined4 *)(*in_RDI + 0x20) = uVar23;
      return *(int *)(*in_RDI + 0x20);
    }
    N_VLinearSum(0x3ff0000000000000,0,in_RCX,uVar8,uVar8);
  }
  else {
    N_VScale(0x3ff0000000000000,in_RCX,uVar8);
  }
  N_VScale(0x3ff0000000000000,uVar8,*puVar3);
  if (bVar24) {
    iVar19 = (*pcVar14)(in_XMM0_Qa,uVar12,*puVar3,uVar8,1);
    if (iVar19 != 0) {
      *piVar21 = 0;
      uVar23 = 0x325;
      if (iVar19 < 0) {
        uVar23 = 0xfffffcd8;
      }
      *(undefined4 *)(*in_RDI + 0x20) = uVar23;
      return *(int *)(*in_RDI + 0x20);
    }
  }
  else {
    N_VScale(0x3ff0000000000000,*puVar3,uVar8);
  }
  if (lVar9 == 0) {
    N_VScale(0x3ff0000000000000,uVar8,*puVar3);
  }
  else {
    N_VProd(lVar9,uVar8,*puVar3);
  }
  __x = (double)N_VDotProd(*puVar3,*puVar3);
  if (0.0 < __x) {
    local_138 = sqrt(__x);
  }
  else {
    local_138 = 0.0;
  }
  local_98 = local_138;
  *(double *)(lVar15 + 0x18) = local_138;
  if (in_XMM0_Qa < local_138) {
    local_a8 = local_138;
    N_VConst(uVar6);
    for (local_e8 = 0; local_e8 <= iVar1; local_e8 = local_e8 + 1) {
      for (local_cc = 0; local_cc <= iVar20; local_cc = local_cc + 1) {
        for (local_d0 = 0; local_d0 < iVar20; local_d0 = local_d0 + 1) {
          *(undefined8 *)(*(long *)(lVar4 + (long)local_cc * 8) + (long)local_d0 * 8) = 0;
        }
      }
      local_90 = 1.0;
      N_VScale(1.0 / local_98,*puVar3,*puVar3);
      for (local_d8 = 0; local_d8 < iVar20; local_d8 = local_d8 + 1) {
        *piVar22 = *piVar22 + 1;
        local_e4 = local_d8 + 1;
        if (bVar26) {
          N_VDiv(puVar3[local_d8],lVar10,uVar8);
        }
        else {
          N_VScale(0x3ff0000000000000,puVar3[local_d8],uVar8);
        }
        if (bVar25) {
          N_VScale(0x3ff0000000000000,uVar8,puVar3[local_e4]);
          iVar19 = (*pcVar14)(in_XMM0_Qa,uVar12,puVar3[local_e4],uVar8,2);
          if (iVar19 != 0) {
            *piVar21 = 0;
            uVar23 = 0x325;
            if (iVar19 < 0) {
              uVar23 = 0xfffffcd8;
            }
            *(undefined4 *)(*in_RDI + 0x20) = uVar23;
            return *(int *)(*in_RDI + 0x20);
          }
        }
        iVar19 = (*pcVar13)(uVar11,uVar8,puVar3[local_e4]);
        if (iVar19 != 0) {
          *piVar21 = 0;
          uVar23 = 0x323;
          if (iVar19 < 0) {
            uVar23 = 0xfffffcdb;
          }
          *(undefined4 *)(*in_RDI + 0x20) = uVar23;
          return *(int *)(*in_RDI + 0x20);
        }
        if (bVar24) {
          iVar19 = (*pcVar14)(in_XMM0_Qa,uVar12,puVar3[local_e4],uVar8,1);
          if (iVar19 != 0) {
            *piVar21 = 0;
            uVar23 = 0x325;
            if (iVar19 < 0) {
              uVar23 = 0xfffffcd8;
            }
            *(undefined4 *)(*in_RDI + 0x20) = uVar23;
            return *(int *)(*in_RDI + 0x20);
          }
        }
        else {
          N_VScale(0x3ff0000000000000,puVar3[local_e4],uVar8);
        }
        if (lVar9 == 0) {
          N_VScale(0x3ff0000000000000,uVar8,puVar3[local_e4]);
        }
        else {
          N_VProd(lVar9,uVar8,puVar3[local_e4]);
        }
        if (iVar2 == 2) {
          SUNClassicalGS(puVar3,lVar4,local_e4,iVar20,
                         *(long *)(lVar4 + (long)local_e4 * 8) + (long)local_d8 * 8,puVar16,puVar17)
          ;
        }
        else {
          SUNModifiedGS(puVar3,lVar4,local_e4,iVar20,
                        *(long *)(lVar4 + (long)local_e4 * 8) + (long)local_d8 * 8);
        }
        iVar19 = SUNQRfact(local_e4,lVar4,lVar5,local_d8);
        if (iVar19 != 0) {
          *piVar21 = 0;
          *(undefined4 *)(*in_RDI + 0x20) = 0x327;
          return *(int *)(*in_RDI + 0x20);
        }
        local_90 = *(double *)(lVar5 + (long)(local_d8 * 2 + 1) * 8) * local_90;
        local_a8 = ABS(local_90 * local_98);
        *(double *)(lVar15 + 0x18) = local_a8;
        if (local_a8 <= in_XMM0_Qa) {
          bVar18 = true;
          break;
        }
        N_VScale(1.0 / *(double *)(*(long *)(lVar4 + (long)local_e4 * 8) + (long)local_d8 * 8),
                 puVar3[local_e4],puVar3[local_e4]);
      }
      *pdVar7 = local_98;
      for (local_cc = 1; local_cc <= local_e4; local_cc = local_cc + 1) {
        pdVar7[local_cc] = 0.0;
      }
      iVar19 = SUNQRsol(local_e4,lVar4,lVar5,pdVar7);
      if (iVar19 != 0) {
        *piVar21 = 0;
        *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd5;
        return *(int *)(*in_RDI + 0x20);
      }
      *puVar16 = 0x3ff0000000000000;
      *puVar17 = uVar6;
      for (local_d4 = 0; local_d4 < local_e4; local_d4 = local_d4 + 1) {
        puVar16[local_d4 + 1] = pdVar7[local_d4];
        puVar17[local_d4 + 1] = puVar3[local_d4];
      }
      N_VLinearCombination(local_e4 + 1,puVar16,puVar17,uVar6);
      if (bVar18) {
        if (bVar26) {
          N_VDiv(uVar6,lVar10,uVar6);
        }
        if (bVar25) {
          iVar20 = (*pcVar14)(in_XMM0_Qa,uVar12,uVar6,uVar8,2);
          if (iVar20 != 0) {
            *piVar21 = 0;
            uVar23 = 0x325;
            if (iVar20 < 0) {
              uVar23 = 0xfffffcd8;
            }
            *(undefined4 *)(*in_RDI + 0x20) = uVar23;
            return *(int *)(*in_RDI + 0x20);
          }
        }
        else {
          N_VScale(0x3ff0000000000000,uVar6,uVar8);
        }
        if (*piVar21 == 0) {
          N_VLinearSum(in_RDX,uVar8,in_RDX);
        }
        else {
          N_VScale(0x3ff0000000000000,uVar8,in_RDX);
        }
        *piVar21 = 0;
        *(undefined4 *)(*in_RDI + 0x20) = 0;
        return *(int *)(*in_RDI + 0x20);
      }
      if (local_e8 == iVar1) break;
      local_a0 = 1.0;
      for (local_cc = local_e4; 0 < local_cc; local_cc = local_cc + -1) {
        pdVar7[local_cc] = local_a0 * *(double *)(lVar5 + (long)(local_cc * 2 + -2) * 8);
        local_a0 = *(double *)(lVar5 + (long)(local_cc * 2 + -1) * 8) * local_a0;
      }
      *pdVar7 = local_a0;
      for (local_cc = 0; local_cc <= local_e4; local_cc = local_cc + 1) {
        pdVar7[local_cc] = local_a0 * local_98 * pdVar7[local_cc];
      }
      local_98 = ABS(local_a0 * local_98);
      for (local_d4 = 0; local_d4 <= local_e4; local_d4 = local_d4 + 1) {
        puVar16[local_d4] = pdVar7[local_d4];
        puVar17[local_d4] = puVar3[local_d4];
      }
      N_VLinearCombination(local_e4 + 1,puVar16,puVar17,*puVar3);
    }
    if (local_138 <= local_a8) {
      *piVar21 = 0;
      *(undefined4 *)(*in_RDI + 0x20) = 0x322;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
    else {
      if (bVar26) {
        N_VDiv(uVar6,lVar10,uVar6);
      }
      if (bVar25) {
        iVar20 = (*pcVar14)(in_XMM0_Qa,uVar12,uVar6,uVar8,2);
        if (iVar20 != 0) {
          *piVar21 = 0;
          uVar23 = 0x325;
          if (iVar20 < 0) {
            uVar23 = 0xfffffcd8;
          }
          *(undefined4 *)(*in_RDI + 0x20) = uVar23;
          return *(int *)(*in_RDI + 0x20);
        }
      }
      else {
        N_VScale(0x3ff0000000000000,uVar6,uVar8);
      }
      if (*piVar21 == 0) {
        N_VLinearSum(in_RDX,uVar8,in_RDX);
      }
      else {
        N_VScale(0x3ff0000000000000,uVar8,in_RDX);
      }
      *piVar21 = 0;
      *(undefined4 *)(*in_RDI + 0x20) = 0x321;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
  }
  else {
    *piVar21 = 0;
    *(undefined4 *)(*in_RDI + 0x20) = 0;
    local_4 = *(int *)(*in_RDI + 0x20);
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                         N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnLeft, preOnRight, scale2, scale1, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* cv;
  N_Vector* Xv;
  int status;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim   = 0;

  /* Make local shortcuts to solver variables. */
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = spgmr");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }
  N_VScale(ONE, vtemp, V[0]);
  SUNCheckLastErr();

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft)
  {
    status = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, V[0], vtemp);
    SUNCheckLastErr();
  }

  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger,
               "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = success",
               *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger,
             "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = continue",
             *res_norm);

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }

    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l = 0; l < l_max; l++)
    {
      SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      status = atimes(A_data, vtemp, V[l_plus_1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed matvec, retval = %d", status);

        return (LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft)
      {
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, V[l_plus_1], vtemp);
        SUNCheckLastErr();
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1)
      {
        N_VProd(s1, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])));
      }

      /*  Update the QR factorization of Hes */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed QR factorization");

        return (LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

      SUNLogInfo(S->sunctx->logger, "linear-iterate",
                 "cur-iter = %i, total-iters = %i, res-norm = %.16g", l + 1,
                 *nli, *res_norm);

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE / Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
      SUNCheckLastErr();

      SUNLogInfoIf(l < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                   "status = continue");
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed QR solve");

      return (LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return */
    if (converged)
    {
      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2)
      {
        N_VDiv(xcor, s2, xcor);
        SUNCheckLastErr();
      }

      if (preOnRight)
      {
        status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, xcor, vtemp);
        SUNCheckLastErr();
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
      {
        N_VScale(ONE, vtemp, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, vtemp, x);
        SUNCheckLastErr();
      }

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = continue");
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2)
    {
      N_VDiv(xcor, s2, xcor);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, xcor, vtemp);
      SUNCheckLastErr();
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
    {
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed residual reduced");

    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
             "status = failed max iterations");

  return (LASTFLAG(S));
}